

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

lyd_node * moveto_axis_node_next_dfs_backward(lyd_node *iter,lyd_node *stop)

{
  lyd_node *plVar1;
  lyd_node *node;
  lyd_node_inner *plVar2;
  
  node = iter->prev;
  if (node->next == (lyd_node *)0x0) {
    node = (lyd_node *)0x0;
  }
  while( true ) {
    if (node == (lyd_node *)0x0) {
      if (iter == (lyd_node *)0x0) {
        plVar2 = (lyd_node_inner *)0x0;
      }
      else {
        plVar2 = iter->parent;
      }
      return (lyd_node *)plVar2;
    }
    plVar1 = lyd_child(node);
    if (plVar1 == (lyd_node *)0x0) break;
    node = plVar1->prev;
  }
  return node;
}

Assistant:

static const struct lyd_node *
moveto_axis_node_next_dfs_backward(const struct lyd_node *iter, const struct lyd_node *stop)
{
    const struct lyd_node *next = NULL;

    /* 1) previous sibling innermost last child */
    next = iter->prev->next ? iter->prev : NULL;
    while (next && lyd_child(next)) {
        next = lyd_child(next);
        next = next->prev;
    }

    if (!next) {
        /* 2) parent */
        iter = lyd_parent(iter);
        if ((!stop && !iter) || (stop && (lyd_parent(iter) == lyd_parent(stop)))) {
            return NULL;
        }
        next = iter;
    }

    return next;
}